

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(const_iterator *a,const_iterator *b)

{
  slot_type *ppFVar1;
  slot_type *ppFVar2;
  slot_type *ppFVar3;
  slot_type *ppFVar4;
  slot_type *ppFVar5;
  bool bVar6;
  slot_type *ppFVar7;
  
  ppFVar1 = (slot_type *)(a->inner_).ctrl_;
  if ((ppFVar1 == (slot_type *)(kEmptyGroup + 0x10) || ppFVar1 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)ppFVar1)) {
    ppFVar2 = (slot_type *)(b->inner_).ctrl_;
    if ((ppFVar2 != (slot_type *)(kEmptyGroup + 0x10) && ppFVar2 != (slot_type *)0x0) &&
       (*(ctrl_t *)ppFVar2 < ~kSentinel)) goto LAB_0016f6c0;
    if (ppFVar1 == (slot_type *)(kEmptyGroup + 0x10) && ppFVar2 == (slot_type *)(kEmptyGroup + 0x10)
       ) {
LAB_0016f6b3:
      return ppFVar1 == ppFVar2;
    }
    if ((ppFVar1 == (slot_type *)(kEmptyGroup + 0x10)) ==
        (ppFVar2 == (slot_type *)(kEmptyGroup + 0x10))) {
      if (ppFVar1 == (slot_type *)0x0 || ppFVar2 == (slot_type *)0x0) goto LAB_0016f6b3;
      if ((ppFVar2 == (slot_type *)kSooControl) == (ppFVar1 == (slot_type *)kSooControl)) {
        ppFVar3 = (a->inner_).field_1.slot_;
        ppFVar4 = (b->inner_).field_1.slot_;
        if (ppFVar1 == (slot_type *)kSooControl) {
          bVar6 = ppFVar3 == ppFVar4;
        }
        else {
          ppFVar7 = ppFVar4;
          ppFVar5 = ppFVar2;
          if (ppFVar2 < ppFVar1) {
            ppFVar7 = ppFVar3;
            ppFVar5 = ppFVar1;
            ppFVar3 = ppFVar4;
          }
          bVar6 = ppFVar3 <= ppFVar7 && ppFVar5 < ppFVar3;
        }
        if (bVar6) goto LAB_0016f6b3;
      }
      goto LAB_0016f6ca;
    }
  }
  else {
    operator==();
LAB_0016f6c0:
    operator==();
  }
  operator==();
LAB_0016f6ca:
  operator==();
}

Assistant:

bool operator==(const const_iterator& a, const const_iterator& b) {
      return a.inner_ == b.inner_;
    }